

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O1

void av1_highbd_convolve_y_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  uint16_t *puVar5;
  undefined1 (*pauVar6) [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint16_t *puVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint16_t *puVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  short sVar22;
  undefined4 uVar23;
  undefined4 uVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar28;
  ushort uVar29;
  ushort uVar39;
  undefined4 uVar30;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined4 uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 local_228 [16];
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  short sStack_170;
  short sStack_16e;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_108 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar51 [16];
  undefined1 auVar61 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar53 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar116 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  
  uVar29 = filter_params_y->taps;
  lVar13 = (long)(int)(((uVar29 >> 1) - 1) * src_stride);
  uVar14 = 0xff;
  if (bd == 0xc) {
    uVar14 = 0xfff;
  }
  uVar18 = 0x3ff;
  if (bd != 10) {
    uVar18 = uVar14;
  }
  auVar24 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
  sStack_170 = auVar24._0_2_;
  sStack_16e = auVar24._2_2_;
  if (uVar29 == 0xc) {
    if (0 < w) {
      uVar21 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar29);
      uVar7 = *(undefined8 *)(filter_params_y->filter_ptr + uVar21 + 8);
      piVar1 = filter_params_y->filter_ptr + uVar21;
      uVar23 = *(undefined4 *)piVar1;
      uVar88 = *(undefined4 *)(piVar1 + 2);
      uVar27 = *(undefined4 *)(piVar1 + 4);
      uVar30 = *(undefined4 *)(piVar1 + 6);
      auVar73._4_4_ = uVar23;
      auVar73._0_4_ = uVar23;
      auVar73._8_4_ = uVar23;
      auVar73._12_4_ = uVar23;
      auVar65._4_4_ = uVar27;
      auVar65._0_4_ = uVar27;
      auVar65._8_4_ = uVar27;
      auVar65._12_4_ = uVar27;
      auVar97._4_4_ = uVar30;
      auVar97._0_4_ = uVar30;
      auVar97._8_4_ = uVar30;
      auVar97._12_4_ = uVar30;
      uVar23 = (undefined4)uVar7;
      uVar27 = (undefined4)((ulong)uVar7 >> 0x20);
      lVar15 = (long)dst_stride;
      lVar20 = (long)(src_stride * 0xc) * 2 + lVar13 * -2;
      lVar16 = (long)(src_stride * 0xb) * 2 + lVar13 * -2;
      uVar21 = 0;
      do {
        if (0 < h) {
          pauVar6 = (undefined1 (*) [16])(src + (uVar21 - lVar13));
          puVar2 = (undefined2 *)(*pauVar6 + (long)(src_stride * 7) * 2);
          puVar3 = (undefined2 *)(*pauVar6 + (long)(src_stride * 5) * 2);
          auVar24 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 6) * 2);
          auVar47 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 3) * 2);
          auVar96 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 4) * 2);
          puVar4 = (undefined2 *)(*pauVar6 + (long)src_stride * 2);
          local_218 = puVar4[4];
          uStack_214 = puVar4[5];
          uStack_210 = puVar4[6];
          uStack_20c = puVar4[7];
          auVar80 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 2) * 2);
          auVar74 = *pauVar6;
          local_138._2_2_ = local_218;
          local_138._0_2_ = auVar74._8_2_;
          local_138._4_2_ = auVar74._10_2_;
          local_138._6_2_ = uStack_214;
          local_138._8_2_ = auVar74._12_2_;
          local_138._10_2_ = uStack_210;
          local_138._12_2_ = auVar74._14_2_;
          local_138._14_2_ = uStack_20c;
          auVar34._0_12_ = auVar74._0_12_;
          auVar34._12_2_ = auVar74._6_2_;
          auVar34._14_2_ = puVar4[3];
          auVar33._12_4_ = auVar34._12_4_;
          auVar33._0_10_ = auVar74._0_10_;
          auVar33._10_2_ = puVar4[2];
          auVar32._10_6_ = auVar33._10_6_;
          auVar32._0_8_ = auVar74._0_8_;
          auVar32._8_2_ = auVar74._4_2_;
          auVar31._8_8_ = auVar32._8_8_;
          auVar31._6_2_ = puVar4[1];
          auVar31._4_2_ = auVar74._2_2_;
          auVar31._0_2_ = auVar74._0_2_;
          auVar31._2_2_ = *puVar4;
          uStack_216 = auVar80._8_2_;
          uStack_212 = auVar80._10_2_;
          uStack_20e = auVar80._12_2_;
          uStack_20a = auVar80._14_2_;
          auVar104._0_2_ = auVar80._0_2_;
          local_1f8._2_2_ = auVar104._0_2_;
          local_1f8._0_2_ = *puVar4;
          local_1f8._4_2_ = puVar4[1];
          local_1f8._6_2_ = auVar80._2_2_;
          local_1f8._8_2_ = puVar4[2];
          local_1f8._10_2_ = auVar80._4_2_;
          local_1f8._12_2_ = puVar4[3];
          local_1f8._14_2_ = auVar80._6_2_;
          auVar49._2_2_ = auVar47._8_2_;
          auVar49._0_2_ = uStack_216;
          auVar49._4_2_ = uStack_212;
          auVar49._6_2_ = auVar47._10_2_;
          auVar49._8_2_ = uStack_20e;
          auVar49._10_2_ = auVar47._12_2_;
          auVar49._12_2_ = uStack_20a;
          auVar49._14_2_ = auVar47._14_2_;
          auVar107._0_12_ = auVar80._0_12_;
          auVar107._12_2_ = auVar80._6_2_;
          auVar107._14_2_ = auVar47._6_2_;
          auVar106._12_4_ = auVar107._12_4_;
          auVar106._0_10_ = auVar80._0_10_;
          auVar106._10_2_ = auVar47._4_2_;
          auVar105._10_6_ = auVar106._10_6_;
          auVar105._0_8_ = auVar80._0_8_;
          auVar105._8_2_ = auVar80._4_2_;
          auVar104._8_8_ = auVar105._8_8_;
          auVar104._6_2_ = auVar47._2_2_;
          auVar104._4_2_ = auVar80._2_2_;
          auVar104._2_2_ = auVar47._0_2_;
          local_228._2_2_ = auVar96._8_2_;
          local_228._0_2_ = auVar47._8_2_;
          local_228._4_2_ = auVar47._10_2_;
          local_228._6_2_ = auVar96._10_2_;
          local_228._8_2_ = auVar47._12_2_;
          local_228._10_2_ = auVar96._12_2_;
          local_228._12_2_ = auVar47._14_2_;
          local_228._14_2_ = auVar96._14_2_;
          auVar113._0_12_ = auVar47._0_12_;
          auVar113._12_2_ = auVar47._6_2_;
          auVar113._14_2_ = auVar96._6_2_;
          auVar112._12_4_ = auVar113._12_4_;
          auVar112._0_10_ = auVar47._0_10_;
          auVar112._10_2_ = auVar96._4_2_;
          auVar111._10_6_ = auVar112._10_6_;
          auVar111._0_8_ = auVar47._0_8_;
          auVar111._8_2_ = auVar47._4_2_;
          auVar110._8_8_ = auVar111._8_8_;
          auVar110._6_2_ = auVar96._2_2_;
          auVar110._4_2_ = auVar47._2_2_;
          auVar89._0_2_ = auVar96._0_2_;
          auVar110._2_2_ = auVar89._0_2_;
          auVar110._0_2_ = auVar47._0_2_;
          auVar79._2_2_ = puVar3[4];
          auVar79._0_2_ = auVar96._8_2_;
          auVar79._4_2_ = auVar96._10_2_;
          auVar79._6_2_ = puVar3[5];
          auVar79._8_2_ = auVar96._12_2_;
          auVar79._10_2_ = puVar3[6];
          auVar79._12_2_ = auVar96._14_2_;
          auVar79._14_2_ = puVar3[7];
          auVar92._0_12_ = auVar96._0_12_;
          auVar92._12_2_ = auVar96._6_2_;
          auVar92._14_2_ = puVar3[3];
          auVar91._12_4_ = auVar92._12_4_;
          auVar91._0_10_ = auVar96._0_10_;
          auVar91._10_2_ = puVar3[2];
          auVar90._10_6_ = auVar91._10_6_;
          auVar90._0_8_ = auVar96._0_8_;
          auVar90._8_2_ = auVar96._4_2_;
          auVar89._8_8_ = auVar90._8_8_;
          auVar89._6_2_ = puVar3[1];
          auVar89._4_2_ = auVar96._2_2_;
          auVar89._2_2_ = *puVar3;
          local_1e8._2_2_ = auVar24._8_2_;
          local_1e8._0_2_ = puVar3[4];
          local_1e8._4_2_ = puVar3[5];
          local_1e8._6_2_ = auVar24._10_2_;
          local_1e8._8_2_ = puVar3[6];
          local_1e8._10_2_ = auVar24._12_2_;
          local_1e8._12_2_ = puVar3[7];
          local_1e8._14_2_ = auVar24._14_2_;
          auVar99._0_2_ = auVar24._0_2_;
          local_208._2_2_ = auVar99._0_2_;
          local_208._0_2_ = *puVar3;
          local_208._4_2_ = puVar3[1];
          local_208._6_2_ = auVar24._2_2_;
          local_208._8_2_ = puVar3[2];
          local_208._10_2_ = auVar24._4_2_;
          local_208._12_2_ = puVar3[3];
          local_208._14_2_ = auVar24._6_2_;
          local_1a8._2_2_ = puVar2[4];
          local_1a8._0_2_ = auVar24._8_2_;
          local_1a8._4_2_ = auVar24._10_2_;
          local_1a8._6_2_ = puVar2[5];
          local_1a8._8_2_ = auVar24._12_2_;
          local_1a8._10_2_ = puVar2[6];
          local_1a8._12_2_ = auVar24._14_2_;
          local_1a8._14_2_ = puVar2[7];
          auVar102._0_12_ = auVar24._0_12_;
          auVar102._12_2_ = auVar24._6_2_;
          auVar102._14_2_ = puVar2[3];
          auVar101._12_4_ = auVar102._12_4_;
          auVar101._0_10_ = auVar24._0_10_;
          auVar101._10_2_ = puVar2[2];
          auVar100._10_6_ = auVar101._10_6_;
          auVar100._0_8_ = auVar24._0_8_;
          auVar100._8_2_ = auVar24._4_2_;
          auVar99._8_8_ = auVar100._8_8_;
          auVar99._6_2_ = puVar2[1];
          auVar99._4_2_ = auVar24._2_2_;
          auVar99._2_2_ = *puVar2;
          puVar3 = (undefined2 *)(*pauVar6 + (long)(src_stride * 8) * 2);
          auVar25._2_2_ = puVar3[4];
          auVar25._0_2_ = puVar2[4];
          auVar25._4_2_ = puVar2[5];
          auVar25._6_2_ = puVar3[5];
          auVar25._8_2_ = puVar2[6];
          auVar25._10_2_ = puVar3[6];
          auVar25._12_2_ = puVar2[7];
          auVar25._14_2_ = puVar3[7];
          local_1b8._2_2_ = *puVar3;
          local_1b8._0_2_ = *puVar2;
          local_1b8._4_2_ = puVar2[1];
          local_1b8._6_2_ = puVar3[1];
          local_1b8._8_2_ = puVar2[2];
          local_1b8._10_2_ = puVar3[2];
          local_1b8._12_2_ = puVar2[3];
          local_1b8._14_2_ = puVar3[3];
          puVar2 = (undefined2 *)(*pauVar6 + (long)(src_stride * 9) * 2);
          local_148._2_2_ = puVar2[4];
          local_148._0_2_ = puVar3[4];
          local_148._4_2_ = puVar3[5];
          local_148._6_2_ = puVar2[5];
          local_148._8_2_ = puVar3[6];
          local_148._10_2_ = puVar2[6];
          local_148._12_2_ = puVar3[7];
          local_148._14_2_ = puVar2[7];
          local_168._2_2_ = *puVar2;
          local_168._0_2_ = *puVar3;
          local_168._4_2_ = puVar3[1];
          local_168._6_2_ = puVar2[1];
          local_168._8_2_ = puVar3[2];
          local_168._10_2_ = puVar2[2];
          local_168._12_2_ = puVar3[3];
          local_168._14_2_ = puVar2[3];
          auVar24 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 10) * 2);
          auVar119._2_2_ = auVar24._8_2_;
          auVar119._0_2_ = puVar2[4];
          auVar119._4_2_ = puVar2[5];
          auVar119._6_2_ = auVar24._10_2_;
          auVar119._8_2_ = puVar2[6];
          auVar119._10_2_ = auVar24._12_2_;
          auVar119._12_2_ = puVar2[7];
          auVar119._14_2_ = auVar24._14_2_;
          local_158._2_2_ = auVar24._0_2_;
          local_158._0_2_ = *puVar2;
          local_158._4_2_ = puVar2[1];
          local_158._6_2_ = auVar24._2_2_;
          local_158._8_2_ = puVar2[2];
          local_158._10_2_ = auVar24._4_2_;
          local_158._12_2_ = puVar2[3];
          local_158._14_2_ = auVar24._6_2_;
          lVar19 = 0;
          puVar12 = src;
          puVar17 = dst;
          do {
            auVar78 = auVar110;
            auVar76 = auVar89;
            auVar77 = auVar49;
            auVar26 = auVar25;
            auVar74 = local_228;
            auVar35 = pmaddwd(auVar31,auVar73);
            auVar9._4_4_ = uVar88;
            auVar9._0_4_ = uVar88;
            auVar9._8_4_ = uVar88;
            auVar9._12_4_ = uVar88;
            auVar46 = pmaddwd(auVar104,auVar9);
            auVar36 = pmaddwd(auVar76,auVar65);
            auVar66 = pmaddwd(auVar99,auVar97);
            auVar8._4_4_ = uVar23;
            auVar8._0_4_ = uVar23;
            auVar8._8_4_ = uVar23;
            auVar8._12_4_ = uVar23;
            auVar37 = pmaddwd(local_168,auVar8);
            auVar11._2_2_ = uStack_216;
            auVar11._0_2_ = local_218;
            auVar11._4_2_ = uStack_214;
            auVar11._6_2_ = uStack_212;
            auVar11._10_2_ = uStack_20e;
            auVar11._8_2_ = uStack_210;
            auVar11._12_2_ = uStack_20c;
            auVar11._14_2_ = uStack_20a;
            local_218 = local_228._0_2_;
            uStack_216 = local_228._2_2_;
            uStack_214 = local_228._4_2_;
            uStack_212 = local_228._6_2_;
            uStack_210 = local_228._8_2_;
            uStack_20e = local_228._10_2_;
            uStack_20c = local_228._12_2_;
            uStack_20a = local_228._14_2_;
            local_228 = local_1e8;
            auVar47 = *(undefined1 (*) [16])((long)puVar12 + lVar16);
            auVar53._0_12_ = auVar24._0_12_;
            auVar53._12_2_ = auVar24._6_2_;
            auVar53._14_2_ = auVar47._6_2_;
            auVar52._12_4_ = auVar53._12_4_;
            auVar52._0_10_ = auVar24._0_10_;
            auVar52._10_2_ = auVar47._4_2_;
            auVar51._10_6_ = auVar52._10_6_;
            auVar51._0_8_ = auVar24._0_8_;
            auVar51._8_2_ = auVar24._4_2_;
            auVar50._8_8_ = auVar51._8_8_;
            auVar50._6_2_ = auVar47._2_2_;
            auVar50._4_2_ = auVar24._2_2_;
            auVar50._0_2_ = auVar24._0_2_;
            auVar50._2_2_ = auVar47._0_2_;
            auVar10._4_4_ = uVar27;
            auVar10._0_4_ = uVar27;
            auVar10._8_4_ = uVar27;
            auVar10._12_4_ = uVar27;
            auVar54 = pmaddwd(auVar50,auVar10);
            auVar55 = pmaddwd(local_1f8,auVar73);
            auVar67 = pmaddwd(auVar78,auVar9);
            auVar96 = local_1b8;
            auVar56 = pmaddwd(local_208,auVar65);
            auVar114 = pmaddwd(local_1b8,auVar97);
            local_1b8 = local_158;
            auVar68 = pmaddwd(local_158,auVar8);
            auVar80 = *(undefined1 (*) [16])((long)puVar12 + lVar20);
            auVar117._0_12_ = auVar47._0_12_;
            auVar117._12_2_ = auVar47._6_2_;
            auVar117._14_2_ = auVar80._6_2_;
            auVar116._12_4_ = auVar117._12_4_;
            auVar116._0_10_ = auVar47._0_10_;
            auVar116._10_2_ = auVar80._4_2_;
            auVar115._10_6_ = auVar116._10_6_;
            auVar115._0_8_ = auVar47._0_8_;
            auVar115._8_2_ = auVar47._4_2_;
            local_158._8_8_ = auVar115._8_8_;
            local_158._6_2_ = auVar80._2_2_;
            local_158._4_2_ = auVar47._2_2_;
            local_158._2_2_ = auVar80._0_2_;
            local_158._0_2_ = auVar47._0_2_;
            auVar118 = pmaddwd(local_158,auVar10);
            auVar48._2_2_ = auVar47._8_2_;
            auVar48._0_2_ = auVar24._8_2_;
            auVar48._4_2_ = auVar24._10_2_;
            auVar48._6_2_ = auVar47._10_2_;
            auVar48._8_2_ = auVar24._12_2_;
            auVar48._10_2_ = auVar47._12_2_;
            auVar48._12_2_ = auVar24._14_2_;
            auVar48._14_2_ = auVar47._14_2_;
            auVar120._2_2_ = auVar80._8_2_;
            auVar120._0_2_ = auVar47._8_2_;
            auVar120._4_2_ = auVar47._10_2_;
            auVar120._6_2_ = auVar80._10_2_;
            auVar120._8_2_ = auVar47._12_2_;
            auVar120._10_2_ = auVar80._12_2_;
            auVar120._12_2_ = auVar47._14_2_;
            auVar120._14_2_ = auVar80._14_2_;
            auVar38._0_4_ =
                 auVar37._0_4_ + auVar66._0_4_ + auVar36._0_4_ + auVar46._0_4_ + auVar35._0_4_ +
                 0x40 + auVar54._0_4_ >> 7;
            auVar38._4_4_ =
                 auVar37._4_4_ + auVar66._4_4_ + auVar36._4_4_ + auVar46._4_4_ + auVar35._4_4_ +
                 0x40 + auVar54._4_4_ >> 7;
            auVar38._8_4_ =
                 auVar37._8_4_ + auVar66._8_4_ + auVar36._8_4_ + auVar46._8_4_ + auVar35._8_4_ +
                 0x40 + auVar54._8_4_ >> 7;
            auVar38._12_4_ =
                 auVar37._12_4_ + auVar66._12_4_ + auVar36._12_4_ + auVar46._12_4_ + auVar35._12_4_
                 + 0x40 + auVar54._12_4_ >> 7;
            auVar69._0_4_ =
                 auVar68._0_4_ + auVar114._0_4_ + auVar56._0_4_ + auVar67._0_4_ + auVar55._0_4_ +
                 0x40 + auVar118._0_4_ >> 7;
            auVar69._4_4_ =
                 auVar68._4_4_ + auVar114._4_4_ + auVar56._4_4_ + auVar67._4_4_ + auVar55._4_4_ +
                 0x40 + auVar118._4_4_ >> 7;
            auVar69._8_4_ =
                 auVar68._8_4_ + auVar114._8_4_ + auVar56._8_4_ + auVar67._8_4_ + auVar55._8_4_ +
                 0x40 + auVar118._8_4_ >> 7;
            auVar69._12_4_ =
                 auVar68._12_4_ + auVar114._12_4_ + auVar56._12_4_ + auVar67._12_4_ + auVar55._12_4_
                 + 0x40 + auVar118._12_4_ >> 7;
            if ((long)uVar21 < (long)((ulong)(uint)w - 4)) {
              auVar54 = pmaddwd(local_138,auVar73);
              auVar66 = pmaddwd(auVar77,auVar9);
              auVar55 = pmaddwd(auVar79,auVar65);
              auVar24 = pmaddwd(local_1a8,auVar97);
              auVar56 = pmaddwd(local_148,auVar8);
              auVar35 = pmaddwd(auVar48,auVar10);
              auVar47 = pmaddwd(auVar11,auVar73);
              auVar74 = pmaddwd(auVar74,auVar9);
              auVar37 = pmaddwd(local_1e8,auVar65);
              auVar67 = pmaddwd(auVar26,auVar97);
              auVar36 = pmaddwd(auVar119,auVar8);
              auVar46 = pmaddwd(auVar120,auVar10);
              auVar108._0_4_ =
                   auVar56._0_4_ + auVar24._0_4_ + auVar55._0_4_ + auVar66._0_4_ + auVar54._0_4_ +
                   0x40 + auVar35._0_4_ >> 7;
              auVar108._4_4_ =
                   auVar56._4_4_ + auVar24._4_4_ + auVar55._4_4_ + auVar66._4_4_ + auVar54._4_4_ +
                   0x40 + auVar35._4_4_ >> 7;
              auVar108._8_4_ =
                   auVar56._8_4_ + auVar24._8_4_ + auVar55._8_4_ + auVar66._8_4_ + auVar54._8_4_ +
                   0x40 + auVar35._8_4_ >> 7;
              auVar108._12_4_ =
                   auVar56._12_4_ +
                   auVar24._12_4_ + auVar55._12_4_ + auVar66._12_4_ + auVar54._12_4_ + 0x40 +
                   auVar35._12_4_ >> 7;
              auVar24 = packssdw(auVar38,auVar108);
              auVar75._0_4_ =
                   auVar36._0_4_ + auVar67._0_4_ + auVar37._0_4_ + auVar74._0_4_ + auVar47._0_4_ +
                   0x40 + auVar46._0_4_ >> 7;
              auVar75._4_4_ =
                   auVar36._4_4_ + auVar67._4_4_ + auVar37._4_4_ + auVar74._4_4_ + auVar47._4_4_ +
                   0x40 + auVar46._4_4_ >> 7;
              auVar75._8_4_ =
                   auVar36._8_4_ + auVar67._8_4_ + auVar37._8_4_ + auVar74._8_4_ + auVar47._8_4_ +
                   0x40 + auVar46._8_4_ >> 7;
              auVar75._12_4_ =
                   auVar36._12_4_ +
                   auVar67._12_4_ + auVar37._12_4_ + auVar74._12_4_ + auVar47._12_4_ + 0x40 +
                   auVar46._12_4_ >> 7;
              auVar47 = packssdw(auVar69,auVar75);
              sVar22 = auVar24._0_2_;
              uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._2_2_;
              uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar24._4_2_;
              uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._6_2_;
              uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar24._8_2_;
              uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._10_2_;
              uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar24._12_2_;
              sVar28 = auVar24._14_2_;
              uVar44 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              uVar45 = (ushort)(sStack_16e < sVar28) * sStack_16e |
                       (ushort)(sStack_16e >= sVar28) * sVar28;
              *puVar17 = (-1 < (short)uVar29) * uVar29;
              puVar17[1] = (-1 < (short)uVar39) * uVar39;
              puVar17[2] = (-1 < (short)uVar40) * uVar40;
              puVar17[3] = (-1 < (short)uVar41) * uVar41;
              puVar17[4] = (-1 < (short)uVar42) * uVar42;
              puVar17[5] = (-1 < (short)uVar43) * uVar43;
              puVar17[6] = (-1 < (short)uVar44) * uVar44;
              puVar17[7] = (-1 < (short)uVar45) * uVar45;
              sVar22 = auVar47._0_2_;
              uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar47._2_2_;
              uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar47._4_2_;
              uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar47._6_2_;
              uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar47._8_2_;
              uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar47._10_2_;
              uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar47._12_2_;
              sVar28 = auVar47._14_2_;
              uVar44 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              uVar45 = (ushort)(sStack_16e < sVar28) * sStack_16e |
                       (ushort)(sStack_16e >= sVar28) * sVar28;
              puVar5 = puVar17 + lVar15;
              *puVar5 = (-1 < (short)uVar29) * uVar29;
              puVar5[1] = (-1 < (short)uVar39) * uVar39;
              puVar5[2] = (-1 < (short)uVar40) * uVar40;
              puVar5[3] = (-1 < (short)uVar41) * uVar41;
              puVar5[4] = (-1 < (short)uVar42) * uVar42;
              puVar5[5] = (-1 < (short)uVar43) * uVar43;
              puVar5[6] = (-1 < (short)uVar44) * uVar44;
              puVar5[7] = (-1 < (short)uVar45) * uVar45;
            }
            else {
              auVar24 = packssdw(auVar38,auVar38);
              sVar22 = auVar24._0_2_;
              uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._2_2_;
              uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar24._4_2_;
              uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._6_2_;
              uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              uVar30 = CONCAT22((-1 < (short)uVar39) * uVar39,(-1 < (short)uVar29) * uVar29);
              auVar24 = packssdw(auVar69,auVar69);
              sVar22 = auVar24._0_2_;
              uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._2_2_;
              uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              sVar22 = auVar24._4_2_;
              uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                       (ushort)(sStack_170 >= sVar22) * sVar22;
              sVar22 = auVar24._6_2_;
              uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                       (ushort)(sStack_16e >= sVar22) * sVar22;
              uVar64 = CONCAT22((-1 < (short)uVar39) * uVar39,(-1 < (short)uVar29) * uVar29);
              if (w == 4) {
                *(ulong *)puVar17 =
                     CONCAT26((-1 < (short)uVar41) * uVar41,
                              CONCAT24((-1 < (short)uVar40) * uVar40,uVar30));
                *(ulong *)(puVar17 + lVar15) =
                     CONCAT26((-1 < (short)uVar43) * uVar43,
                              CONCAT24((-1 < (short)uVar42) * uVar42,uVar64));
              }
              else {
                *(undefined4 *)puVar17 = uVar30;
                *(undefined4 *)(puVar17 + lVar15) = uVar64;
              }
            }
            lVar19 = lVar19 + 2;
            puVar17 = puVar17 + lVar15 * 2;
            puVar12 = puVar12 + (long)src_stride * 2;
            auVar25 = auVar119;
            auVar31 = auVar104;
            auVar49 = auVar79;
            auVar24 = auVar80;
            auVar79 = local_1a8;
            auVar89 = auVar99;
            auVar99 = local_168;
            auVar104 = auVar76;
            auVar110 = local_208;
            auVar119 = auVar120;
            local_208 = auVar96;
            local_1f8 = auVar78;
            local_1e8 = auVar26;
            local_1a8 = local_148;
            local_168 = auVar50;
            local_148 = auVar48;
            local_138 = auVar77;
          } while (lVar19 < h);
        }
        uVar21 = uVar21 + 8;
        dst = dst + 8;
        lVar20 = lVar20 + 0x10;
        lVar16 = lVar16 + 0x10;
      } while (uVar21 < (uint)w);
    }
  }
  else if (0 < w) {
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar29;
    uVar23 = *(undefined4 *)piVar1;
    local_158._4_4_ = *(undefined4 *)(piVar1 + 2);
    local_168._4_4_ = *(undefined4 *)(piVar1 + 4);
    local_108._4_4_ = *(undefined4 *)(piVar1 + 6);
    auVar24._4_4_ = uVar23;
    auVar24._0_4_ = uVar23;
    auVar24._8_4_ = uVar23;
    auVar24._12_4_ = uVar23;
    local_158._0_4_ = local_158._4_4_;
    local_158._8_4_ = local_158._4_4_;
    local_158._12_4_ = local_158._4_4_;
    local_168._0_4_ = local_168._4_4_;
    local_168._8_4_ = local_168._4_4_;
    local_168._12_4_ = local_168._4_4_;
    local_108._0_4_ = local_108._4_4_;
    local_108._8_4_ = local_108._4_4_;
    local_108._12_4_ = local_108._4_4_;
    lVar15 = (long)dst_stride;
    lVar20 = (long)(src_stride * 8) * 2 + lVar13 * -2;
    lVar16 = (long)(src_stride * 7) * 2 + lVar13 * -2;
    uVar21 = 0;
    do {
      if (0 < h) {
        pauVar6 = (undefined1 (*) [16])(src + (uVar21 - lVar13));
        auVar47 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 5) * 2);
        auVar96 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 6) * 2);
        auVar80 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 3) * 2);
        auVar74 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 4) * 2);
        auVar26 = *(undefined1 (*) [16])(*pauVar6 + (long)src_stride * 2);
        auVar35 = *(undefined1 (*) [16])(*pauVar6 + (long)(src_stride * 2) * 2);
        auVar36 = *pauVar6;
        auVar54._2_2_ = auVar26._8_2_;
        auVar54._0_2_ = auVar36._8_2_;
        auVar54._4_2_ = auVar36._10_2_;
        auVar54._6_2_ = auVar26._10_2_;
        auVar54._8_2_ = auVar36._12_2_;
        auVar54._10_2_ = auVar26._12_2_;
        auVar54._12_2_ = auVar36._14_2_;
        auVar54._14_2_ = auVar26._14_2_;
        auVar67._0_12_ = auVar36._0_12_;
        auVar67._12_2_ = auVar36._6_2_;
        auVar67._14_2_ = auVar26._6_2_;
        auVar76._12_4_ = auVar67._12_4_;
        auVar76._0_10_ = auVar36._0_10_;
        auVar76._10_2_ = auVar26._4_2_;
        auVar68._10_6_ = auVar76._10_6_;
        auVar68._0_8_ = auVar36._0_8_;
        auVar68._8_2_ = auVar36._4_2_;
        auVar37._8_8_ = auVar68._8_8_;
        auVar37._6_2_ = auVar26._2_2_;
        auVar37._4_2_ = auVar36._2_2_;
        auVar37._0_2_ = auVar36._0_2_;
        auVar37._2_2_ = auVar26._0_2_;
        auVar55._2_2_ = auVar35._8_2_;
        auVar55._0_2_ = auVar26._8_2_;
        auVar55._4_2_ = auVar26._10_2_;
        auVar55._6_2_ = auVar35._10_2_;
        auVar55._8_2_ = auVar26._12_2_;
        auVar55._10_2_ = auVar35._12_2_;
        auVar55._12_2_ = auVar26._14_2_;
        auVar55._14_2_ = auVar35._14_2_;
        auVar95._0_12_ = auVar26._0_12_;
        auVar95._12_2_ = auVar26._6_2_;
        auVar95._14_2_ = auVar35._6_2_;
        auVar94._12_4_ = auVar95._12_4_;
        auVar94._0_10_ = auVar26._0_10_;
        auVar94._10_2_ = auVar35._4_2_;
        auVar93._10_6_ = auVar94._10_6_;
        auVar93._0_8_ = auVar26._0_8_;
        auVar93._8_2_ = auVar26._4_2_;
        auVar77._8_8_ = auVar93._8_8_;
        auVar77._6_2_ = auVar35._2_2_;
        auVar77._4_2_ = auVar26._2_2_;
        auVar36._0_2_ = auVar35._0_2_;
        auVar77._2_2_ = auVar36._0_2_;
        auVar77._0_2_ = auVar26._0_2_;
        auVar26._2_2_ = auVar80._8_2_;
        auVar26._0_2_ = auVar35._8_2_;
        auVar26._4_2_ = auVar35._10_2_;
        auVar26._6_2_ = auVar80._10_2_;
        auVar26._8_2_ = auVar35._12_2_;
        auVar26._10_2_ = auVar80._12_2_;
        auVar26._12_2_ = auVar35._14_2_;
        auVar26._14_2_ = auVar80._14_2_;
        auVar78._0_12_ = auVar35._0_12_;
        auVar78._12_2_ = auVar35._6_2_;
        auVar78._14_2_ = auVar80._6_2_;
        auVar114._12_4_ = auVar78._12_4_;
        auVar114._0_10_ = auVar35._0_10_;
        auVar114._10_2_ = auVar80._4_2_;
        auVar118._10_6_ = auVar114._10_6_;
        auVar118._0_8_ = auVar35._0_8_;
        auVar118._8_2_ = auVar35._4_2_;
        auVar36._8_8_ = auVar118._8_8_;
        auVar36._6_2_ = auVar80._2_2_;
        auVar36._4_2_ = auVar35._2_2_;
        auVar36._2_2_ = auVar80._0_2_;
        auVar66._2_2_ = auVar74._8_2_;
        auVar66._0_2_ = auVar80._8_2_;
        auVar66._4_2_ = auVar80._10_2_;
        auVar66._6_2_ = auVar74._10_2_;
        auVar66._8_2_ = auVar80._12_2_;
        auVar66._10_2_ = auVar74._12_2_;
        auVar66._12_2_ = auVar80._14_2_;
        auVar66._14_2_ = auVar74._14_2_;
        auVar72._0_12_ = auVar80._0_12_;
        auVar72._12_2_ = auVar80._6_2_;
        auVar72._14_2_ = auVar74._6_2_;
        auVar71._12_4_ = auVar72._12_4_;
        auVar71._0_10_ = auVar80._0_10_;
        auVar71._10_2_ = auVar74._4_2_;
        auVar70._10_6_ = auVar71._10_6_;
        auVar70._0_8_ = auVar80._0_8_;
        auVar70._8_2_ = auVar80._4_2_;
        auVar46._8_8_ = auVar70._8_8_;
        auVar46._6_2_ = auVar74._2_2_;
        auVar46._4_2_ = auVar80._2_2_;
        auVar35._0_2_ = auVar74._0_2_;
        auVar46._2_2_ = auVar35._0_2_;
        auVar46._0_2_ = auVar80._0_2_;
        auVar56._2_2_ = auVar47._8_2_;
        auVar56._0_2_ = auVar74._8_2_;
        auVar56._4_2_ = auVar74._10_2_;
        auVar56._6_2_ = auVar47._10_2_;
        auVar56._8_2_ = auVar74._12_2_;
        auVar56._10_2_ = auVar47._12_2_;
        auVar56._12_2_ = auVar74._14_2_;
        auVar56._14_2_ = auVar47._14_2_;
        auVar59._0_12_ = auVar74._0_12_;
        auVar59._12_2_ = auVar74._6_2_;
        auVar59._14_2_ = auVar47._6_2_;
        auVar58._12_4_ = auVar59._12_4_;
        auVar58._0_10_ = auVar74._0_10_;
        auVar58._10_2_ = auVar47._4_2_;
        auVar57._10_6_ = auVar58._10_6_;
        auVar57._0_8_ = auVar74._0_8_;
        auVar57._8_2_ = auVar74._4_2_;
        auVar35._8_8_ = auVar57._8_8_;
        auVar35._6_2_ = auVar47._2_2_;
        auVar35._4_2_ = auVar74._2_2_;
        auVar35._2_2_ = auVar47._0_2_;
        auVar74._2_2_ = auVar96._8_2_;
        auVar74._0_2_ = auVar47._8_2_;
        auVar74._4_2_ = auVar47._10_2_;
        auVar74._6_2_ = auVar96._10_2_;
        auVar74._8_2_ = auVar47._12_2_;
        auVar74._10_2_ = auVar96._12_2_;
        auVar74._12_2_ = auVar47._14_2_;
        auVar74._14_2_ = auVar96._14_2_;
        auVar83._0_12_ = auVar47._0_12_;
        auVar83._12_2_ = auVar47._6_2_;
        auVar83._14_2_ = auVar96._6_2_;
        auVar82._12_4_ = auVar83._12_4_;
        auVar82._0_10_ = auVar47._0_10_;
        auVar82._10_2_ = auVar96._4_2_;
        auVar81._10_6_ = auVar82._10_6_;
        auVar81._0_8_ = auVar47._0_8_;
        auVar81._8_2_ = auVar47._4_2_;
        auVar80._8_8_ = auVar81._8_8_;
        auVar80._6_2_ = auVar96._2_2_;
        auVar80._4_2_ = auVar47._2_2_;
        auVar80._2_2_ = auVar96._0_2_;
        auVar80._0_2_ = auVar47._0_2_;
        lVar19 = 0;
        puVar12 = dst;
        puVar17 = src;
        do {
          auVar59 = auVar74;
          auVar68 = auVar46;
          auVar67 = auVar26;
          auVar47 = *(undefined1 (*) [16])((long)puVar17 + lVar16);
          pauVar6 = (undefined1 (*) [16])((long)puVar17 + lVar20);
          auVar63._0_12_ = auVar96._0_12_;
          auVar63._12_2_ = auVar96._6_2_;
          auVar63._14_2_ = auVar47._6_2_;
          auVar62._12_4_ = auVar63._12_4_;
          auVar62._0_10_ = auVar96._0_10_;
          auVar62._10_2_ = auVar47._4_2_;
          auVar61._10_6_ = auVar62._10_6_;
          auVar61._0_8_ = auVar96._0_8_;
          auVar61._8_2_ = auVar96._4_2_;
          auVar60._8_8_ = auVar61._8_8_;
          auVar60._6_2_ = auVar47._2_2_;
          auVar60._4_2_ = auVar96._2_2_;
          auVar60._0_2_ = auVar96._0_2_;
          auVar60._2_2_ = auVar47._0_2_;
          auVar87._0_12_ = auVar47._0_12_;
          auVar87._12_2_ = auVar47._6_2_;
          auVar87._14_2_ = *(undefined2 *)(*pauVar6 + 6);
          auVar86._12_4_ = auVar87._12_4_;
          auVar86._0_10_ = auVar47._0_10_;
          auVar86._10_2_ = *(undefined2 *)(*pauVar6 + 4);
          auVar85._10_6_ = auVar86._10_6_;
          auVar85._0_8_ = auVar47._0_8_;
          auVar85._8_2_ = auVar47._4_2_;
          auVar84._8_8_ = auVar85._8_8_;
          auVar84._6_2_ = *(undefined2 *)(*pauVar6 + 2);
          auVar84._4_2_ = auVar47._2_2_;
          auVar84._2_2_ = *(undefined2 *)*pauVar6;
          auVar84._0_2_ = auVar47._0_2_;
          auVar26 = pmaddwd(auVar37,auVar24);
          auVar46 = pmaddwd(auVar36,local_158);
          auVar37 = pmaddwd(auVar35,local_168);
          auVar76 = pmaddwd(auVar60,local_108);
          auVar114 = pmaddwd(auVar77,auVar24);
          auVar77 = pmaddwd(auVar68,local_158);
          auVar118 = pmaddwd(auVar80,local_168);
          auVar78 = pmaddwd(auVar84,local_108);
          auVar109._2_2_ = auVar47._8_2_;
          auVar109._0_2_ = auVar96._8_2_;
          auVar109._4_2_ = auVar96._10_2_;
          auVar109._6_2_ = auVar47._10_2_;
          auVar109._8_2_ = auVar96._12_2_;
          auVar109._10_2_ = auVar47._12_2_;
          auVar109._12_2_ = auVar96._14_2_;
          auVar109._14_2_ = auVar47._14_2_;
          auVar74._2_2_ = *(undefined2 *)(*pauVar6 + 8);
          auVar74._0_2_ = auVar47._8_2_;
          auVar74._4_2_ = auVar47._10_2_;
          auVar74._6_2_ = *(undefined2 *)(*pauVar6 + 10);
          auVar74._8_2_ = auVar47._12_2_;
          auVar74._10_2_ = *(undefined2 *)(*pauVar6 + 0xc);
          auVar74._12_2_ = auVar47._14_2_;
          auVar74._14_2_ = *(undefined2 *)(*pauVar6 + 0xe);
          auVar47._0_4_ = auVar37._0_4_ + auVar46._0_4_ + auVar26._0_4_ + 0x40 + auVar76._0_4_ >> 7;
          auVar47._4_4_ = auVar37._4_4_ + auVar46._4_4_ + auVar26._4_4_ + 0x40 + auVar76._4_4_ >> 7;
          auVar47._8_4_ = auVar37._8_4_ + auVar46._8_4_ + auVar26._8_4_ + 0x40 + auVar76._8_4_ >> 7;
          auVar47._12_4_ =
               auVar37._12_4_ + auVar46._12_4_ + auVar26._12_4_ + 0x40 + auVar76._12_4_ >> 7;
          auVar96._0_4_ =
               auVar118._0_4_ + auVar77._0_4_ + auVar114._0_4_ + 0x40 + auVar78._0_4_ >> 7;
          auVar96._4_4_ =
               auVar118._4_4_ + auVar77._4_4_ + auVar114._4_4_ + 0x40 + auVar78._4_4_ >> 7;
          auVar96._8_4_ =
               auVar118._8_4_ + auVar77._8_4_ + auVar114._8_4_ + 0x40 + auVar78._8_4_ >> 7;
          auVar96._12_4_ =
               auVar118._12_4_ + auVar77._12_4_ + auVar114._12_4_ + 0x40 + auVar78._12_4_ >> 7;
          if ((long)uVar21 < (long)((ulong)(uint)w - 4)) {
            auVar54 = pmaddwd(auVar54,auVar24);
            auVar26 = pmaddwd(auVar67,local_158);
            auVar76 = pmaddwd(auVar56,local_168);
            auVar37 = pmaddwd(auVar109,local_108);
            auVar55 = pmaddwd(auVar55,auVar24);
            auVar46 = pmaddwd(auVar66,local_158);
            auVar78 = pmaddwd(auVar59,local_168);
            auVar77 = pmaddwd(auVar74,local_108);
            auVar98._0_4_ =
                 auVar76._0_4_ + auVar26._0_4_ + auVar54._0_4_ + 0x40 + auVar37._0_4_ >> 7;
            auVar98._4_4_ =
                 auVar76._4_4_ + auVar26._4_4_ + auVar54._4_4_ + 0x40 + auVar37._4_4_ >> 7;
            auVar98._8_4_ =
                 auVar76._8_4_ + auVar26._8_4_ + auVar54._8_4_ + 0x40 + auVar37._8_4_ >> 7;
            auVar98._12_4_ =
                 auVar76._12_4_ + auVar26._12_4_ + auVar54._12_4_ + 0x40 + auVar37._12_4_ >> 7;
            auVar47 = packssdw(auVar47,auVar98);
            auVar103._0_4_ =
                 auVar78._0_4_ + auVar46._0_4_ + auVar55._0_4_ + 0x40 + auVar77._0_4_ >> 7;
            auVar103._4_4_ =
                 auVar78._4_4_ + auVar46._4_4_ + auVar55._4_4_ + 0x40 + auVar77._4_4_ >> 7;
            auVar103._8_4_ =
                 auVar78._8_4_ + auVar46._8_4_ + auVar55._8_4_ + 0x40 + auVar77._8_4_ >> 7;
            auVar103._12_4_ =
                 auVar78._12_4_ + auVar46._12_4_ + auVar55._12_4_ + 0x40 + auVar77._12_4_ >> 7;
            auVar96 = packssdw(auVar96,auVar103);
            sVar22 = auVar47._0_2_;
            uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._2_2_;
            uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar47._4_2_;
            uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._6_2_;
            uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar47._8_2_;
            uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._10_2_;
            uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar47._12_2_;
            sVar28 = auVar47._14_2_;
            uVar44 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            uVar45 = (ushort)(sStack_16e < sVar28) * sStack_16e |
                     (ushort)(sStack_16e >= sVar28) * sVar28;
            *puVar12 = (-1 < (short)uVar29) * uVar29;
            puVar12[1] = (-1 < (short)uVar39) * uVar39;
            puVar12[2] = (-1 < (short)uVar40) * uVar40;
            puVar12[3] = (-1 < (short)uVar41) * uVar41;
            puVar12[4] = (-1 < (short)uVar42) * uVar42;
            puVar12[5] = (-1 < (short)uVar43) * uVar43;
            puVar12[6] = (-1 < (short)uVar44) * uVar44;
            puVar12[7] = (-1 < (short)uVar45) * uVar45;
            sVar22 = auVar96._0_2_;
            uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar96._2_2_;
            uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar96._4_2_;
            uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar96._6_2_;
            uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar96._8_2_;
            uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar96._10_2_;
            uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar96._12_2_;
            sVar28 = auVar96._14_2_;
            uVar44 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            uVar45 = (ushort)(sStack_16e < sVar28) * sStack_16e |
                     (ushort)(sStack_16e >= sVar28) * sVar28;
            puVar5 = puVar12 + lVar15;
            *puVar5 = (-1 < (short)uVar29) * uVar29;
            puVar5[1] = (-1 < (short)uVar39) * uVar39;
            puVar5[2] = (-1 < (short)uVar40) * uVar40;
            puVar5[3] = (-1 < (short)uVar41) * uVar41;
            puVar5[4] = (-1 < (short)uVar42) * uVar42;
            puVar5[5] = (-1 < (short)uVar43) * uVar43;
            puVar5[6] = (-1 < (short)uVar44) * uVar44;
            puVar5[7] = (-1 < (short)uVar45) * uVar45;
          }
          else {
            auVar47 = packssdw(auVar47,auVar47);
            sVar22 = auVar47._0_2_;
            uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._2_2_;
            uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar47._4_2_;
            uVar40 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._6_2_;
            uVar41 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            uVar23 = CONCAT22((-1 < (short)uVar39) * uVar39,(-1 < (short)uVar29) * uVar29);
            auVar47 = packssdw(auVar96,auVar96);
            sVar22 = auVar47._0_2_;
            uVar29 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._2_2_;
            uVar39 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            sVar22 = auVar47._4_2_;
            uVar42 = (ushort)(sStack_170 < sVar22) * sStack_170 |
                     (ushort)(sStack_170 >= sVar22) * sVar22;
            sVar22 = auVar47._6_2_;
            uVar43 = (ushort)(sStack_16e < sVar22) * sStack_16e |
                     (ushort)(sStack_16e >= sVar22) * sVar22;
            uVar88 = CONCAT22((-1 < (short)uVar39) * uVar39,(-1 < (short)uVar29) * uVar29);
            if (w == 4) {
              *(ulong *)puVar12 =
                   CONCAT26((-1 < (short)uVar41) * uVar41,
                            CONCAT24((-1 < (short)uVar40) * uVar40,uVar23));
              *(ulong *)(puVar12 + lVar15) =
                   CONCAT26((-1 < (short)uVar43) * uVar43,
                            CONCAT24((-1 < (short)uVar42) * uVar42,uVar88));
            }
            else {
              *(undefined4 *)puVar12 = uVar23;
              *(undefined4 *)(puVar12 + lVar15) = uVar88;
            }
          }
          auVar96 = *pauVar6;
          lVar19 = lVar19 + 2;
          puVar12 = puVar12 + lVar15 * 2;
          puVar17 = puVar17 + (long)src_stride * 2;
          auVar37 = auVar36;
          auVar36 = auVar35;
          auVar26 = auVar56;
          auVar35 = auVar60;
          auVar46 = auVar80;
          auVar80 = auVar84;
          auVar77 = auVar68;
          auVar54 = auVar67;
          auVar55 = auVar66;
          auVar56 = auVar109;
          auVar66 = auVar59;
        } while (lVar19 < h);
      }
      uVar21 = uVar21 + 8;
      dst = dst + 8;
      lVar20 = lVar20 + 0x10;
      lVar16 = lVar16 + 0x10;
    } while (uVar21 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_y_qn, int bd) {
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  if (filter_params_y->taps == 12) {
    __m128i s[24], coeffs_y[6];

    prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));
      __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
      __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));
      __m128i s9 = _mm_loadu_si128((__m128i *)(data + 9 * src_stride));
      __m128i s10 = _mm_loadu_si128((__m128i *)(data + 10 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);
      s[3] = _mm_unpacklo_epi16(s6, s7);
      s[4] = _mm_unpacklo_epi16(s8, s9);

      s[6] = _mm_unpackhi_epi16(s0, s1);
      s[7] = _mm_unpackhi_epi16(s2, s3);
      s[8] = _mm_unpackhi_epi16(s4, s5);
      s[9] = _mm_unpackhi_epi16(s6, s7);
      s[10] = _mm_unpackhi_epi16(s8, s9);

      s[12] = _mm_unpacklo_epi16(s1, s2);
      s[13] = _mm_unpacklo_epi16(s3, s4);
      s[14] = _mm_unpacklo_epi16(s5, s6);
      s[15] = _mm_unpacklo_epi16(s7, s8);
      s[16] = _mm_unpacklo_epi16(s9, s10);

      s[18] = _mm_unpackhi_epi16(s1, s2);
      s[19] = _mm_unpackhi_epi16(s3, s4);
      s[20] = _mm_unpackhi_epi16(s5, s6);
      s[21] = _mm_unpackhi_epi16(s7, s8);
      s[22] = _mm_unpackhi_epi16(s9, s10);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s11 = _mm_loadu_si128((__m128i *)(data + 11 * src_stride));
        __m128i s12 = _mm_loadu_si128((__m128i *)(data + 12 * src_stride));

        s[5] = _mm_unpacklo_epi16(s10, s11);
        s[11] = _mm_unpackhi_epi16(s10, s11);

        s[17] = _mm_unpacklo_epi16(s11, s12);
        s[23] = _mm_unpackhi_epi16(s11, s12);

        const __m128i res_a0 = convolve_12tap(s, coeffs_y);
        __m128i res_a_round0 = _mm_sra_epi32(
            _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

        const __m128i res_a1 = convolve_12tap(s + 12, coeffs_y);
        __m128i res_a_round1 = _mm_sra_epi32(
            _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m128i res_b0 = convolve_12tap(s + 6, coeffs_y);
          __m128i res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

          const __m128i res_b1 = convolve_12tap(s + 18, coeffs_y);
          __m128i res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

          __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
          res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
          res_16bit0 = _mm_max_epi16(res_16bit0, zero);

          __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
          res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
          res_16bit1 = _mm_max_epi16(res_16bit1, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_16bit1);
        } else if (w == 4) {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_a_round1);
        } else {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          *((int *)(&dst[i * dst_stride + j])) =
              _mm_cvtsi128_si32(res_a_round0);

          *((int *)(&dst[i * dst_stride + j + dst_stride])) =
              _mm_cvtsi128_si32(res_a_round1);
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];
        s[3] = s[4];
        s[4] = s[5];

        s[6] = s[7];
        s[7] = s[8];
        s[8] = s[9];
        s[9] = s[10];
        s[10] = s[11];

        s[12] = s[13];
        s[13] = s[14];
        s[14] = s[15];
        s[15] = s[16];
        s[16] = s[17];

        s[18] = s[19];
        s[19] = s[20];
        s[20] = s[21];
        s[21] = s[22];
        s[22] = s[23];

        s10 = s12;
      }
    }
  } else {
    __m128i s[16], coeffs_y[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      {
        __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
        __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
        __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
        __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
        __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
        __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
        __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

        s[0] = _mm_unpacklo_epi16(s0, s1);
        s[1] = _mm_unpacklo_epi16(s2, s3);
        s[2] = _mm_unpacklo_epi16(s4, s5);

        s[4] = _mm_unpackhi_epi16(s0, s1);
        s[5] = _mm_unpackhi_epi16(s2, s3);
        s[6] = _mm_unpackhi_epi16(s4, s5);

        s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
        s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
        s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

        s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
        s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
        s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

        for (i = 0; i < h; i += 2) {
          data = &src_ptr[i * src_stride + j];

          __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
          __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

          s[3] = _mm_unpacklo_epi16(s6, s7);
          s[7] = _mm_unpackhi_epi16(s6, s7);

          s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
          s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

          const __m128i res_a0 = convolve(s, coeffs_y);
          __m128i res_a_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

          const __m128i res_a1 = convolve(s + 8, coeffs_y);
          __m128i res_a_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

          if (w - j > 4) {
            const __m128i res_b0 = convolve(s + 4, coeffs_y);
            __m128i res_b_round0 = _mm_sra_epi32(
                _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

            const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
            __m128i res_b_round1 = _mm_sra_epi32(
                _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

            __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
            res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
            res_16bit0 = _mm_max_epi16(res_16bit0, zero);

            __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
            res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
            res_16bit1 = _mm_max_epi16(res_16bit1, zero);

            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16bit1);
          } else if (w == 4) {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_a_round1);
          } else {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            *((int *)(&dst[i * dst_stride + j])) =
                _mm_cvtsi128_si32(res_a_round0);

            *((int *)(&dst[i * dst_stride + j + dst_stride])) =
                _mm_cvtsi128_si32(res_a_round1);
          }

          s[0] = s[1];
          s[1] = s[2];
          s[2] = s[3];

          s[4] = s[5];
          s[5] = s[6];
          s[6] = s[7];

          s[0 + 8] = s[1 + 8];
          s[1 + 8] = s[2 + 8];
          s[2 + 8] = s[3 + 8];

          s[4 + 8] = s[5 + 8];
          s[5 + 8] = s[6 + 8];
          s[6 + 8] = s[7 + 8];

          s6 = s8;
        }
      }
    }
  }
}